

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.h
# Opt level: O2

object_task<crnlib::threaded_resampler> * __thiscall
crnlib::
crnlib_new<crnlib::object_task<crnlib::threaded_resampler>,crnlib::threaded_resampler*,void(crnlib::threaded_resampler::*)(unsigned_long_long,void*),crnlib::object_task_flags>
          (crnlib *this,threaded_resampler **init0,offset_in_threaded_resampler_to_subr *init1,
          object_task_flags *init2)

{
  threaded_resampler *ptVar1;
  threaded_resampler *ptVar2;
  threaded_resampler *ptVar3;
  offset_in_threaded_resampler_to_subr oVar4;
  object_task<crnlib::threaded_resampler> *poVar5;
  
  poVar5 = (object_task<crnlib::threaded_resampler> *)crnlib_malloc(0x28);
  ptVar1 = *(threaded_resampler **)this;
  oVar4 = *init1;
  (poVar5->super_executable_task)._vptr_executable_task = (_func_int **)&PTR_execute_task_001b9628;
  ptVar2 = *init0;
  ptVar3 = init0[1];
  poVar5->m_pObject = ptVar1;
  poVar5->m_pMethod = (object_method_ptr)ptVar2;
  *(threaded_resampler **)&poVar5->field_0x18 = ptVar3;
  poVar5->m_flags = (uint)oVar4;
  return poVar5;
}

Assistant:

inline T* crnlib_new(const A& init0, const B& init1, const C& init2)
    {
        T* p = static_cast<T*>(crnlib_malloc(sizeof(T)));
        return new (static_cast<void*>(p)) T(init0, init1, init2);
    }